

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECDSA.cpp
# Opt level: O0

bool __thiscall
OSSLECDSA::generateKeyPair
          (OSSLECDSA *this,AsymmetricKeyPair **ppKeyPair,AsymmetricParameters *parameters,
          RNG *param_4)

{
  uint uVar1;
  int iVar2;
  EC_KEY *key;
  EC_GROUP *group;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  ECParameters *in_RDX;
  undefined8 *in_RSI;
  OSSLECKeyPair *kp;
  EC_GROUP *grp;
  EC_KEY *eckey;
  ECParameters *params;
  ByteString *in_stack_ffffffffffffff90;
  bool local_1;
  
  if ((in_RSI == (undefined8 *)0x0) || (in_RDX == (ECParameters *)0x0)) {
    local_1 = false;
  }
  else {
    uVar1 = (*(in_RDX->super_AsymmetricParameters).super_Serialisable._vptr_Serialisable[3])
                      (in_RDX,ECParameters::type);
    if ((uVar1 & 1) == 0) {
      softHSMLog(3,"generateKeyPair",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                 ,0x11a,"Invalid parameters supplied for ECDSA key generation");
      local_1 = false;
    }
    else {
      key = EC_KEY_new();
      if (key == (EC_KEY *)0x0) {
        softHSMLog(3,"generateKeyPair",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                   ,0x125,"Failed to instantiate OpenSSL ECDSA object");
        local_1 = false;
      }
      else {
        ECParameters::getEC(in_RDX);
        group = OSSL::byteString2grp(in_stack_ffffffffffffff90);
        EC_KEY_set_group(key,(EC_GROUP *)group);
        EC_GROUP_free((EC_GROUP *)group);
        iVar2 = EC_KEY_generate_key(key);
        if (iVar2 == 0) {
          uVar3 = ERR_get_error();
          softHSMLog(3,"generateKeyPair",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLECDSA.cpp"
                     ,0x130,"ECDSA key generation failed (0x%08X)",uVar3);
          EC_KEY_free(key);
          local_1 = false;
        }
        else {
          plVar4 = (long *)operator_new(200);
          plVar4[0x16] = 0;
          plVar4[0x17] = 0;
          plVar4[0x14] = 0;
          plVar4[0x15] = 0;
          plVar4[0x12] = 0;
          plVar4[0x13] = 0;
          plVar4[0x10] = 0;
          plVar4[0x11] = 0;
          plVar4[0xe] = 0;
          plVar4[0xf] = 0;
          plVar4[0xc] = 0;
          plVar4[0xd] = 0;
          plVar4[10] = 0;
          plVar4[0xb] = 0;
          plVar4[8] = 0;
          plVar4[9] = 0;
          plVar4[6] = 0;
          plVar4[7] = 0;
          plVar4[4] = 0;
          plVar4[5] = 0;
          plVar4[2] = 0;
          plVar4[3] = 0;
          *plVar4 = 0;
          plVar4[1] = 0;
          plVar4[0x18] = 0;
          OSSLECKeyPair::OSSLECKeyPair((OSSLECKeyPair *)0x0);
          plVar5 = (long *)(**(code **)(*plVar4 + 0x18))();
          (**(code **)(*plVar5 + 0x60))(plVar5,key);
          plVar5 = (long *)(**(code **)(*plVar4 + 0x28))();
          (**(code **)(*plVar5 + 0x70))(plVar5,key);
          *in_RSI = plVar4;
          EC_KEY_free(key);
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool OSSLECDSA::generateKeyPair(AsymmetricKeyPair** ppKeyPair, AsymmetricParameters* parameters, RNG* /*rng = NULL */)
{
	// Check parameters
	if ((ppKeyPair == NULL) ||
	    (parameters == NULL))
	{
		return false;
	}

	if (!parameters->areOfType(ECParameters::type))
	{
		ERROR_MSG("Invalid parameters supplied for ECDSA key generation");

		return false;
	}

	ECParameters* params = (ECParameters*) parameters;

	// Generate the key-pair
	EC_KEY* eckey = EC_KEY_new();
	if (eckey == NULL)
	{
		ERROR_MSG("Failed to instantiate OpenSSL ECDSA object");

		return false;
	}

	EC_GROUP* grp = OSSL::byteString2grp(params->getEC());
	EC_KEY_set_group(eckey, grp);
	EC_GROUP_free(grp);

	if (!EC_KEY_generate_key(eckey))
	{
		ERROR_MSG("ECDSA key generation failed (0x%08X)", ERR_get_error());

		EC_KEY_free(eckey);

		return false;
	}

	// Create an asymmetric key-pair object to return
	OSSLECKeyPair* kp = new OSSLECKeyPair();

	((OSSLECPublicKey*) kp->getPublicKey())->setFromOSSL(eckey);
	((OSSLECPrivateKey*) kp->getPrivateKey())->setFromOSSL(eckey);

	*ppKeyPair = kp;

	// Release the key
	EC_KEY_free(eckey);

	return true;
}